

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QList<int> * __thiscall QDockAreaLayout::findSeparator(QDockAreaLayout *this,QPoint *pos)

{
  bool bVar1;
  ulong uVar2;
  QPoint *in_RDX;
  QDockAreaLayoutInfo *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QDockAreaLayoutInfo *info;
  int i;
  QList<int> *result;
  QRect rect;
  undefined4 in_stack_ffffffffffffff88;
  parameter_type in_stack_ffffffffffffff8c;
  QRect *pQVar3;
  QDockAreaLayoutInfo *this_00;
  int local_50;
  QDockAreaLayoutInfo *this_01;
  int in_stack_ffffffffffffffd4;
  QDockAreaLayout *in_stack_ffffffffffffffd8;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->x2 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)(in_RDI + 1) = &DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = in_RDI;
  this_01 = in_RSI;
  QList<int>::QList((QList<int> *)0x577d56);
  local_50 = 0;
  do {
    if (3 < local_50) {
LAB_00577ed1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return (QList<int> *)pQVar3;
      }
      __stack_chk_fail();
    }
    this_00 = (QDockAreaLayoutInfo *)&in_RSI[local_50].item_list;
    bVar1 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x577d9c);
    if (!bVar1) {
      local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = (undefined1  [16])
                 separatorRect(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
      bVar1 = QRect::isNull(in_RDI);
      if ((!bVar1) && (*(int *)&in_RSI[4].item_list.d.d == 1)) {
        QRect::adjust((QRect *)in_RSI,(int)((ulong)pQVar3 >> 0x20),(int)pQVar3,
                      (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      }
      uVar2 = QRect::contains((QPoint *)local_18,SUB81(in_RDX,0));
      if (((uVar2 & 1) != 0) && (bVar1 = QDockAreaLayoutInfo::hasFixedSize(this_00), !bVar1)) {
        QList<int>::operator<<((QList<int> *)in_RDI,in_stack_ffffffffffffff8c);
        goto LAB_00577ed1;
      }
      uVar2 = QRect::contains((QPoint *)&this_00->rect,SUB81(in_RDX,0));
      if ((uVar2 & 1) != 0) {
        QDockAreaLayoutInfo::findSeparator(this_01,in_RDX);
        QList<int>::operator=
                  ((QList<int> *)in_RDI,
                   (QList<int> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        QList<int>::~QList((QList<int> *)0x577e9d);
        bVar1 = QList<int>::isEmpty((QList<int> *)0x577ea7);
        if (!bVar1) {
          QList<int>::prepend((QList<int> *)0x577eb9,in_stack_ffffffffffffff8c);
          goto LAB_00577ed1;
        }
      }
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

QList<int> QDockAreaLayout::findSeparator(const QPoint &pos) const
{
    QList<int> result;
    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &info = docks[i];
        if (info.isEmpty())
            continue;
        QRect rect = separatorRect(i);
        if (!rect.isNull() && sep == 1)
            rect.adjust(-2, -2, 2, 2);
        if (rect.contains(pos) && !info.hasFixedSize()) {
            result << i;
            break;
        } else if (info.rect.contains(pos)) {
            result = docks[i].findSeparator(pos);
            if (!result.isEmpty()) {
                result.prepend(i);
                break;
            }
        }
    }

    return result;
}